

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::LE_Detonation_PDU::SetFlag2Flag(LE_Detonation_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  
  if (-1 < (char)(this->m_DetonationFlag1Union).m_ui8Flag == F) {
    (this->m_DetonationFlag1Union).m_ui8Flag =
         (this->m_DetonationFlag1Union).m_ui8Flag & 0x7f | F << 7;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (F - 1 | 1);
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetFlag2Flag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag1Union.m_ui8Flag2 )return;

    m_DetonationFlag1Union.m_ui8Flag2 = F;

    if( F )
    {
        m_ui16PDULength += 1; // 1 = size of flag 2 field
    }
    else
    {
        m_ui16PDULength -= 1;
    }
}